

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

TypedExpectation<StrictMockProblemBuilder_&()> * __thiscall
testing::internal::TypedExpectation<StrictMockProblemBuilder_&()>::WillOnce
          (TypedExpectation<StrictMockProblemBuilder_&()> *this,
          Action<StrictMockProblemBuilder_&()> *action)

{
  Clause CVar1;
  uint uVar2;
  char *pcVar3;
  ActionInterface<StrictMockProblemBuilder_&()> *pAVar4;
  FailureReporterInterface *pFVar5;
  CardinalityInterface *pCVar6;
  CardinalityInterface *this_00;
  linked_ptr<const_testing::CardinalityInterface> local_48;
  CardinalityInterface local_38 [2];
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  local_48.value_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().","");
  if (5 < (int)CVar1) {
    uVar2 = (this->super_ExpectationBase).line_;
    pcVar3 = (this->super_ExpectationBase).file_;
    pFVar5 = GetFailureReporter();
    (*pFVar5->_vptr_FailureReporterInterface[2])(pFVar5,0,pcVar3,(ulong)uVar2,&local_48);
  }
  if (local_48.value_ != local_38) {
    operator_delete(local_48.value_,(long)local_38[0]._vptr_CardinalityInterface + 1);
  }
  (this->super_ExpectationBase).last_clause_ = kWillOnce;
  pCVar6 = (CardinalityInterface *)operator_new(0x10);
  pAVar4 = (action->impl_).value_;
  pCVar6->_vptr_CardinalityInterface = (_func_int **)pAVar4;
  this_00 = pCVar6 + 1;
  if (pAVar4 == (ActionInterface<StrictMockProblemBuilder_&()> *)0x0) {
    this_00->_vptr_CardinalityInterface = (_func_int **)this_00;
  }
  else {
    linked_ptr_internal::join((linked_ptr_internal *)this_00,&(action->impl_).link_);
  }
  local_48.value_ = pCVar6;
  std::vector<void_const*,std::allocator<void_const*>>::emplace_back<void_const*>
            ((vector<void_const*,std::allocator<void_const*>> *)
             &(this->super_ExpectationBase).untyped_actions_,&local_48.value_);
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    Exactly((testing *)&local_48,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    linked_ptr<const_testing::CardinalityInterface>::operator=
              (&(this->super_ExpectationBase).cardinality_.impl_,&local_48);
    linked_ptr<const_testing::CardinalityInterface>::~linked_ptr(&local_48);
  }
  return this;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }